

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine_generic.c
# Opt level: O3

rt_function_error_t exec_affine_generic(rt_function_t *f)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  code *pcVar3;
  int iVar4;
  int bpos;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  puVar1 = *f->local_context;
  if (0 < *(int *)(puVar1 + 9)) {
    iVar5 = 0;
    do {
      (*(code *)puVar1[10])(0,puVar1[8],iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 < *(int *)(puVar1 + 9));
  }
  if (0 < *(int *)(puVar1 + 0xc)) {
    iVar5 = *(int *)(puVar1 + 0xd);
    iVar4 = 0;
    do {
      iVar9 = iVar5 * iVar4;
      if (0 < iVar5) {
        iVar7 = *(int *)((long)puVar1 + 100);
        iVar6 = 0;
        do {
          iVar5 = *(int *)((long)puVar1 + 100);
          fVar10 = (float)(*(code *)puVar1[0xb])(puVar1[8]);
          if (0 < *(int *)((long)puVar1 + 100)) {
            iVar8 = 0;
            do {
              fVar11 = (float)(*(code *)puVar1[3])(puVar1[2],iVar5 * iVar6 + iVar8);
              fVar12 = (float)(*(code *)puVar1[1])(*puVar1,iVar7 * iVar4 + iVar8);
              fVar10 = fVar10 + fVar12 * fVar11;
              iVar8 = iVar8 + 1;
            } while (iVar8 < *(int *)((long)puVar1 + 100));
          }
          if (puVar1[6] != 0) {
            fVar11 = (float)(*(code *)puVar1[7])(puVar1[6],iVar6);
            fVar10 = fVar10 * fVar11;
          }
          (*(code *)puVar1[10])(fVar10,puVar1[8],iVar6 + iVar9);
          iVar6 = iVar6 + 1;
          iVar5 = *(int *)(puVar1 + 0xd);
        } while (iVar6 < iVar5);
      }
      if ((puVar1[4] != 0) && (0 < iVar5)) {
        iVar7 = 0;
        do {
          iVar5 = iVar7 + iVar9;
          uVar2 = puVar1[8];
          pcVar3 = (code *)puVar1[10];
          fVar10 = (float)(*(code *)puVar1[0xb])(uVar2,iVar5);
          fVar11 = (float)(*(code *)puVar1[5])(puVar1[4],iVar7);
          (*pcVar3)(fVar11 + fVar10,uVar2,iVar5);
          iVar7 = iVar7 + 1;
          iVar5 = *(int *)(puVar1 + 0xd);
        } while (iVar7 < iVar5);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < *(int *)(puVar1 + 0xc));
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_affine_generic(rt_function_t *f) {
  affine_private_t *p =
      (affine_private_t *)(((affine_local_context_t *)(f->local_context))
                               ->data);
  int i, j, k; // Iterators.

  // Clear output
  for (i = 0; i < p->output_size; i++) {
    p->set_output(p->output, i, 0);
  }

  for (k = 0; k < p->base_loop_size; k++) {
    int output_offset = k * p->output_loop_size;
    int input_offset = k * p->input_loop_size;

    // Weight
    for (j = 0; j < p->output_loop_size; ++j) {
      int opos = output_offset + j;
      int weight_offset = j * p->input_loop_size;
      float y0 = p->get_output(p->output, opos);

      for (i = 0; i < p->input_loop_size; ++i) {
        int ipos = input_offset + i;
        int wpos = weight_offset + i;

        float w = p->get_weight(p->weight, wpos);
        float x = p->get_input(p->input, ipos);
        y0 += x * w;
      }

      if (p->alpha) {
        y0 *= p->get_alpha(p->alpha, j);
      }

      p->set_output(p->output, opos, y0);
    }

    // Bias
    if (p->bias) {
      for (i = 0; i < p->output_loop_size; i++) {
        int opos = output_offset + i;
        int bpos = i;
        p->set_output(p->output, opos,
                      p->get_output(p->output, opos) +
                          p->get_bias(p->bias, bpos));
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}